

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Skeleton_blockers_simplices_iterators.h
# Opt level: O0

Trie * __thiscall
Gudhi::skeleton_blocker::
Simplex_around_vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>,_Gudhi::skeleton_blocker::Skeleton_blocker_link_superior<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>_>
::build_trie(Simplex_around_vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>,_Gudhi::skeleton_blocker::Skeleton_blocker_link_superior<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>_>
             *this,Link_vertex_handle link_vh,Trie *parent)

{
  type_conflict1 tVar1;
  bool bVar2;
  Vertex_handle v;
  uint uVar3;
  Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
  *pTVar4;
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> *this_00;
  Trie *child;
  undefined1 local_188 [8];
  Simplex simplex_node_plus_nv;
  undefined1 local_150 [4];
  Link_vertex_handle nv;
  Neighbors_vertices_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>
  __end0;
  Neighbors_vertices_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>
  __begin0;
  iterator_range_base<Gudhi::skeleton_blocker::Neighbors_vertices_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_boost::iterators::incrementable_traversal_tag>
  local_c8;
  iterator_range_base<Gudhi::skeleton_blocker::Neighbors_vertices_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_boost::iterators::incrementable_traversal_tag>
  *local_48;
  Complex_neighbors_vertices_range *__range3;
  boost_vertex_handle local_30;
  boost_vertex_handle local_2c;
  Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
  *local_28;
  Trie *res;
  Trie *parent_local;
  Simplex_around_vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>,_Gudhi::skeleton_blocker::Skeleton_blocker_link_superior<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>_>
  *this_local;
  Link_vertex_handle link_vh_local;
  
  res = parent;
  parent_local = (Trie *)this;
  this_local._4_4_ = link_vh.vertex;
  pTVar4 = (Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
            *)operator_new(0x28);
  local_30 = this_local._4_4_;
  local_2c = (boost_vertex_handle)parent_vertex(this,this_local._4_4_);
  Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
  ::Trie(pTVar4,(Vertex_handle)local_2c,res);
  local_28 = pTVar4;
  this_00 = (Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> *)
            std::
            __shared_ptr_access<Gudhi::skeleton_blocker::Skeleton_blocker_link_superior<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<Gudhi::skeleton_blocker::Skeleton_blocker_link_superior<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->link_v);
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::vertex_range
            ((Complex_neighbors_vertices_range *)&local_c8,this_00,(Vertex_handle)this_local._4_4_);
  local_48 = &local_c8;
  boost::iterator_range_detail::
  iterator_range_base<Gudhi::skeleton_blocker::Neighbors_vertices_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_boost::iterators::incrementable_traversal_tag>
  ::begin((Neighbors_vertices_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>
           *)&__end0.end_.m_g,local_48);
  boost::iterator_range_detail::
  iterator_range_base<Gudhi::skeleton_blocker::Neighbors_vertices_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_boost::iterators::incrementable_traversal_tag>
  ::end((Neighbors_vertices_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>
         *)local_150,local_48);
  while (tVar1 = boost::iterators::operator!=
                           ((iterator_facade<Gudhi::skeleton_blocker::Neighbors_vertices_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_boost::iterators::forward_traversal_tag,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_long>
                             *)&__end0.end_.m_g,
                            (iterator_facade<Gudhi::skeleton_blocker::Neighbors_vertices_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_boost::iterators::forward_traversal_tag,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_long>
                             *)local_150), tVar1) {
    simplex_node_plus_nv.simplex_set._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
         boost::iterators::detail::
         iterator_facade_base<Gudhi::skeleton_blocker::Neighbors_vertices_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_boost::iterators::forward_traversal_tag,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_long,_false,_false>
         ::operator*((iterator_facade_base<Gudhi::skeleton_blocker::Neighbors_vertices_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_boost::iterators::forward_traversal_tag,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_long,_false,_false>
                      *)&__end0.end_.m_g);
    bVar2 = Skeleton_blocker_simple_traits::Vertex_handle::operator<
                      ((Vertex_handle *)((long)&this_local + 4),
                       (Vertex_handle *)
                       ((long)&simplex_node_plus_nv.simplex_set._M_t._M_impl.super__Rb_tree_header.
                               _M_node_count + 4));
    if (bVar2) {
      Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
      ::simplex((Simplex *)local_188,local_28);
      v = parent_vertex(this,simplex_node_plus_nv.simplex_set._M_t._M_impl.super__Rb_tree_header.
                             _M_node_count._4_4_);
      Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
      ::add_vertex((Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
                    *)local_188,(Vertex_handle)v.vertex);
      uVar3 = (*this->complex->_vptr_Skeleton_blocker_complex[9])(this->complex,local_188);
      pTVar4 = local_28;
      if ((uVar3 & 1) != 0) {
        child = build_trie(this,(Link_vertex_handle)
                                simplex_node_plus_nv.simplex_set._M_t._M_impl.super__Rb_tree_header.
                                _M_node_count._4_4_,local_28);
        Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
        ::add_child(pTVar4,child);
      }
      Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
      ::~Skeleton_blocker_simplex
                ((Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
                  *)local_188);
    }
    boost::iterators::detail::
    iterator_facade_base<Gudhi::skeleton_blocker::Neighbors_vertices_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_boost::iterators::forward_traversal_tag,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_long,_false,_false>
    ::operator++((iterator_facade_base<Gudhi::skeleton_blocker::Neighbors_vertices_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_boost::iterators::forward_traversal_tag,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_long,_false,_false>
                  *)&__end0.end_.m_g);
  }
  return local_28;
}

Assistant:

Trie* build_trie(Link_vertex_handle link_vh, Trie* parent) {
    Trie* res = new Trie(parent_vertex(link_vh), parent);
    for (Link_vertex_handle nv : link_v->vertex_range(link_vh)) {
      if (link_vh < nv) {
        Simplex simplex_node_plus_nv(res->simplex());
        simplex_node_plus_nv.add_vertex(parent_vertex(nv));
        if (complex->contains(simplex_node_plus_nv)) {
          res->add_child(build_trie(nv, res));
        }
      }
    }
    return res;
  }